

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_doc_comment.cc
# Opt level: O2

void google::protobuf::compiler::java::WriteServiceDocComment
               (Printer *printer,ServiceDescriptor *service)

{
  char cVar1;
  undefined1 local_80 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  pointer local_30;
  pointer pbStack_28;
  pointer local_20;
  
  io::Printer::Print<>(printer,"/**\n");
  local_80._16_8_ = &local_60;
  local_80._24_8_ = 0;
  local_60._M_local_buf[0] = '\0';
  local_50._M_p = (pointer)&local_40;
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_30 = (pointer)0x0;
  pbStack_28 = (pointer)0x0;
  local_20 = (pointer)0x0;
  cVar1 = google::protobuf::ServiceDescriptor::GetSourceLocation((SourceLocation *)service);
  if (cVar1 != '\0') {
    WriteDocCommentBodyForLocation(printer,(SourceLocation *)local_80);
  }
  SourceLocation::~SourceLocation((SourceLocation *)local_80);
  EscapeJavadoc((string *)local_80,*(string **)(service + 8));
  io::Printer::Print<char[9],std::__cxx11::string>
            (printer," * Protobuf service {@code $fullname$}\n */\n",(char (*) [9])"fullname",
             (string *)local_80);
  std::__cxx11::string::~string((string *)local_80);
  return;
}

Assistant:

void WriteServiceDocComment(io::Printer* printer,
                            const ServiceDescriptor* service) {
  printer->Print("/**\n");
  WriteDocCommentBody(printer, service);
  printer->Print(
      " * Protobuf service {@code $fullname$}\n"
      " */\n",
      "fullname", EscapeJavadoc(service->full_name()));
}